

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cgi::fastcgi::on_header_read(fastcgi *this,error_code *e,size_t param_3,handler *h)

{
  bool bVar1;
  unique_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>,_std::default_delete<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>_>
  *ptr;
  on_header_read_binder *in_RCX;
  error_code *in_RSI;
  long in_RDI;
  io_handler *in_stack_00000038;
  size_t in_stack_00000040;
  void *in_stack_00000048;
  fastcgi *in_stack_00000050;
  unique_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>,_std::default_delete<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>_>
  cb;
  size_t rec_size;
  size_t cur_size;
  pointer in_stack_ffffffffffffff38;
  error_code *in_stack_ffffffffffffff40;
  unique_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>,_std::default_delete<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>_>
  *this_00;
  shared_ptr<cppcms::impl::cgi::fastcgi> *in_stack_ffffffffffffff50;
  callback<void_(const_std::error_code_&,_unsigned_long)> *this_01;
  fastcgi *in_stack_ffffffffffffff58;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  unique_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>,_std::default_delete<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>_>
  local_48 [3];
  callback<void_(const_std::error_code_&,_unsigned_long)> *local_30;
  size_type local_28;
  on_header_read_binder *local_20;
  
  local_20 = in_RCX;
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    booster::callback<void_(const_std::error_code_&)>::operator()
              ((callback<void_(const_std::error_code_&)> *)in_stack_ffffffffffffff60,
               (error_code *)in_stack_ffffffffffffff58);
  }
  else {
    fcgi_header::to_host((fcgi_header *)in_stack_ffffffffffffff40);
    local_28 = std::vector<char,_std::allocator<char>_>::size
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x140));
    local_30 = (callback<void_(const_std::error_code_&,_unsigned_long)> *)
               (long)(int)((uint)*(ushort *)(in_RDI + 0x134) + (uint)*(byte *)(in_RDI + 0x136));
    if (local_30 == (callback<void_(const_std::error_code_&,_unsigned_long)> *)0x0) {
      std::error_code::error_code(in_stack_ffffffffffffff40);
      booster::callback<void_(const_std::error_code_&)>::operator()
                ((callback<void_(const_std::error_code_&)> *)in_stack_ffffffffffffff60,
                 (error_code *)in_stack_ffffffffffffff58);
    }
    else {
      std::vector<char,_std::allocator<char>_>::resize
                (in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
      std::
      unique_ptr<booster::callable<void(std::error_code_const&,unsigned_long)>,std::default_delete<booster::callable<void(std::error_code_const&,unsigned_long)>>>
      ::
      unique_ptr<std::default_delete<booster::callable<void(std::error_code_const&,unsigned_long)>>,void>
                ((unique_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>,_std::default_delete<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>_>
                  *)in_stack_ffffffffffffff40);
      operator_new(0x28);
      self(in_stack_ffffffffffffff58);
      on_header_read_binder::on_header_read_binder
                (local_20,(handler *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      this_00 = local_48;
      std::
      unique_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>,_std::default_delete<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>_>
      ::reset(this_00,in_stack_ffffffffffffff38);
      std::shared_ptr<cppcms::impl::cgi::fastcgi>::~shared_ptr
                ((shared_ptr<cppcms::impl::cgi::fastcgi> *)0x48d2b7);
      ptr = (unique_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>,_std::default_delete<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>_>
             *)std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x140),local_28);
      this_01 = local_30;
      std::
      unique_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>,_std::default_delete<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>_>
      ::unique_ptr(this_00,(unique_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>,_std::default_delete<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>_>
                            *)in_stack_ffffffffffffff38);
      booster::callback<void(std::error_code_const&,unsigned_long)>::
      callback<booster::callable<void(std::error_code_const&,unsigned_long)>>(this_01,ptr);
      async_read_from_socket
                (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038);
      booster::callback<void_(const_std::error_code_&,_unsigned_long)>::~callback
                ((callback<void_(const_std::error_code_&,_unsigned_long)> *)0x48d32c);
      std::
      unique_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>,_std::default_delete<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>_>
      ::~unique_ptr(this_00);
      std::
      unique_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>,_std::default_delete<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>_>
      ::~unique_ptr(this_00);
    }
  }
  return;
}

Assistant:

void on_header_read(booster::system::error_code const &e,size_t /*unused read*/,handler const &h)
		{
			if(e) { h(e); return; }
			header_.to_host();
			size_t cur_size=body_.size();
			size_t rec_size=header_.content_length+header_.padding_length;
			if(rec_size==0) {
				h(booster::system::error_code());
				return;
			}
			body_.resize(cur_size + rec_size);
			std::unique_ptr<booster::callable<void(booster::system::error_code const &,size_t)> > cb;
			cb.reset(new on_header_read_binder(h,self()));
			async_read_from_socket(
				&body_[cur_size],rec_size,
				std::move(cb));
		}